

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderExecutor.cpp
# Opt level: O1

void __thiscall
vkt::shaderexecutor::anon_unknown_0::BufferIoExecutor::BufferIoExecutor
          (BufferIoExecutor *this,Context *context,ShaderSpec *shaderSpec)

{
  vector<vkt::shaderexecutor::(anonymous_namespace)::BufferIoExecutor::VarLayout,_std::allocator<vkt::shaderexecutor::(anonymous_namespace)::BufferIoExecutor::VarLayout>_>
  *layout;
  vector<vkt::shaderexecutor::(anonymous_namespace)::BufferIoExecutor::VarLayout,_std::allocator<vkt::shaderexecutor::(anonymous_namespace)::BufferIoExecutor::VarLayout>_>
  *layout_00;
  
  ShaderExecutor::ShaderExecutor(&this->super_ShaderExecutor,context,shaderSpec);
  (this->super_ShaderExecutor)._vptr_ShaderExecutor = (_func_int **)&PTR__BufferIoExecutor_00d32e40;
  (this->m_outputAlloc).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data
  .ptr = (Allocation *)0x0;
  (this->m_inputBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  (this->m_inputBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->m_inputBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_inputBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_outputBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.m_internal = 0;
  (this->m_outputBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_deviceIface
       = (DeviceInterface *)0x0;
  (this->m_outputBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_outputBuffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_inputAlloc).super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.
  ptr = (Allocation *)0x0;
  (this->m_inputLayout).
  super__Vector_base<vkt::shaderexecutor::(anonymous_namespace)::BufferIoExecutor::VarLayout,_std::allocator<vkt::shaderexecutor::(anonymous_namespace)::BufferIoExecutor::VarLayout>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_inputLayout).
  super__Vector_base<vkt::shaderexecutor::(anonymous_namespace)::BufferIoExecutor::VarLayout,_std::allocator<vkt::shaderexecutor::(anonymous_namespace)::BufferIoExecutor::VarLayout>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_inputLayout).
  super__Vector_base<vkt::shaderexecutor::(anonymous_namespace)::BufferIoExecutor::VarLayout,_std::allocator<vkt::shaderexecutor::(anonymous_namespace)::BufferIoExecutor::VarLayout>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_outputLayout).
  super__Vector_base<vkt::shaderexecutor::(anonymous_namespace)::BufferIoExecutor::VarLayout,_std::allocator<vkt::shaderexecutor::(anonymous_namespace)::BufferIoExecutor::VarLayout>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_outputLayout).
  super__Vector_base<vkt::shaderexecutor::(anonymous_namespace)::BufferIoExecutor::VarLayout,_std::allocator<vkt::shaderexecutor::(anonymous_namespace)::BufferIoExecutor::VarLayout>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_outputLayout).
  super__Vector_base<vkt::shaderexecutor::(anonymous_namespace)::BufferIoExecutor::VarLayout,_std::allocator<vkt::shaderexecutor::(anonymous_namespace)::BufferIoExecutor::VarLayout>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  computeVarLayout((BufferIoExecutor *)&(this->super_ShaderExecutor).m_shaderSpec,
                   (vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                    *)&this->m_inputLayout,layout);
  computeVarLayout((BufferIoExecutor *)&(this->super_ShaderExecutor).m_shaderSpec.outputs,
                   (vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
                    *)&this->m_outputLayout,layout_00);
  return;
}

Assistant:

BufferIoExecutor::BufferIoExecutor (Context& context, const ShaderSpec& shaderSpec)
	: ShaderExecutor(context, shaderSpec)
{
	computeVarLayout(m_shaderSpec.inputs, &m_inputLayout);
	computeVarLayout(m_shaderSpec.outputs, &m_outputLayout);
}